

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int poptReadConfigFiles(poptContext con,char *paths)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  char *local_68;
  char *fn;
  int local_48;
  int xx;
  int i;
  int ac;
  char **av;
  char *pcStack_30;
  int rc;
  char *pe;
  char *p;
  char *buf;
  char *paths_local;
  poptContext con_local;
  
  buf = paths;
  paths_local = (char *)con;
  if (paths == (char *)0x0) {
    local_68 = (char *)0x0;
  }
  else {
    sVar2 = strlen(paths);
    pcVar3 = (char *)malloc(sVar2 + 1);
    if (pcVar3 == (char *)0x0) {
      fprintf(_stderr,"virtual memory exhausted.\n");
      exit(1);
    }
    local_68 = strcpy(pcVar3,buf);
  }
  p = local_68;
  av._4_4_ = 0;
  pe = local_68;
  while( true ) {
    bVar4 = false;
    if (pe != (char *)0x0) {
      bVar4 = *pe != '\0';
    }
    if (!bVar4) break;
    _i = (char **)0x0;
    xx = 0;
    pcStack_30 = strchr(pe,0x3a);
    pcVar3 = pe;
    if ((pcStack_30 == (char *)0x0) || (*pcStack_30 != ':')) {
      sVar2 = strlen(pe);
      pcStack_30 = pcVar3 + sVar2;
    }
    else {
      *pcStack_30 = '\0';
      pcStack_30 = pcStack_30 + 1;
    }
    poptGlob((poptContext)paths_local,pe,&xx,(char ***)&i);
    for (local_48 = 0; local_48 < xx; local_48 = local_48 + 1) {
      pcVar3 = _i[local_48];
      iVar1 = poptSaneFile(pcVar3);
      if (iVar1 != 0) {
        iVar1 = poptReadConfigFile((poptContext)paths_local,pcVar3);
        if ((iVar1 != 0) && (av._4_4_ == 0)) {
          av._4_4_ = iVar1;
        }
        free(_i[local_48]);
        _i[local_48] = (char *)0x0;
      }
    }
    free(_i);
    _i = (char **)0x0;
    pe = pcStack_30;
  }
  if (p != (char *)0x0) {
    free(p);
  }
  return av._4_4_;
}

Assistant:

int poptReadConfigFiles(poptContext con, const char * paths)
{
    char * buf = (paths ? xstrdup(paths) : NULL);
    const char * p;
    char * pe;
    int rc = 0;		/* assume success */

    for (p = buf; p != NULL && *p != '\0'; p = pe) {
	const char ** av = NULL;
	int ac = 0;
	int i;
	int xx;

	/* locate start of next path element */
	pe = strchr(p, ':');
	if (pe != NULL && *pe == ':')
	    *pe++ = '\0';
	else
	    pe = (char *) (p + strlen(p));

	xx = poptGlob(con, p, &ac, &av);

	/* work-off each resulting file from the path element */
	for (i = 0; i < ac; i++) {
	    const char * fn = av[i];
	    if (!poptSaneFile(fn))
		continue;
	    xx = poptReadConfigFile(con, fn);
	    if (xx && rc == 0)
		rc = xx;
	    free((void *)av[i]);
	    av[i] = NULL;
	}
	free(av);
	av = NULL;
    }

    if (buf)
	free(buf);

    return rc;
}